

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_ifconfig_ip(char *ifname,int fd,uint8_t *ip,uint8_t *mask_ip,uint8_t *gateway_ip)

{
  int iVar1;
  uint32_t uVar2;
  uint *puVar3;
  char local_f0 [8];
  ifreq ifr;
  rtentry route;
  sockaddr_in sin;
  sockaddr_in *addr;
  uint8_t *gateway_ip_local;
  uint8_t *mask_ip_local;
  uint8_t *ip_local;
  int fd_local;
  char *ifname_local;
  
  memset(local_f0,0,0x28);
  memset((void *)((long)&ifr.ifr_ifru + 0x10),0,0x78);
  memset(&route.rt_irtt,0,0x10);
  lws_strncpy(local_f0,ifname,0x10);
  lws_plat_if_up(ifname,fd,0);
  route.rt_irtt = 2;
  route._116_4_ = htonl(*(uint32_t *)ip);
  ifr.ifr_ifrn._8_8_ = CONCAT44(route._116_4_,CONCAT22(route._114_2_,route.rt_irtt));
  iVar1 = ioctl(fd,0x8916,local_f0);
  if (iVar1 < 0) {
    _lws_log(1,"%s: SIOCSIFADDR fail\n","lws_plat_ifconfig_ip");
    ifname_local._4_4_ = 1;
  }
  else {
    route._116_4_ = htonl(*(uint32_t *)mask_ip);
    ifr.ifr_ifrn._8_8_ = CONCAT44(route._116_4_,CONCAT22(route._114_2_,route.rt_irtt));
    iVar1 = ioctl(fd,0x891c,local_f0);
    if (iVar1 < 0) {
      _lws_log(1,"%s: SIOCSIFNETMASK fail\n","lws_plat_ifconfig_ip");
      ifname_local._4_4_ = 1;
    }
    else {
      lws_plat_if_up(ifname,fd,1);
      route.rt_dst.sa_data[6] = '\x02';
      route.rt_dst.sa_data[7] = '\0';
      route.rt_dst.sa_data._10_4_ = htonl(*(uint32_t *)gateway_ip);
      route.rt_pad1._0_2_ = 2;
      route.rt_pad1._4_4_ = 0;
      route.rt_gateway.sa_data[6] = '\x02';
      route.rt_gateway.sa_data[7] = '\0';
      route.rt_gateway.sa_data[10] = '\0';
      route.rt_gateway.sa_data[0xb] = '\0';
      route.rt_gateway.sa_data[0xc] = '\0';
      route.rt_gateway.sa_data[0xd] = '\0';
      route.rt_genmask.sa_data[6] = '\x03';
      route.rt_genmask.sa_data[7] = '\0';
      route.rt_tos = 'd';
      route.rt_class = '\0';
      route._80_8_ = ifname;
      iVar1 = ioctl(fd,0x890b,(undefined1 *)((long)&ifr.ifr_ifru + 0x10));
      if (iVar1 < 0) {
        uVar2 = htonl(*(uint32_t *)gateway_ip);
        puVar3 = (uint *)__errno_location();
        _lws_log(1,"%s: SIOCADDRT 0x%x fail: %d\n","lws_plat_ifconfig_ip",(ulong)uVar2,
                 (ulong)*puVar3);
        ifname_local._4_4_ = 1;
      }
      else {
        ifname_local._4_4_ = 0;
      }
    }
  }
  return ifname_local._4_4_;
}

Assistant:

int
lws_plat_ifconfig_ip(const char *ifname, int fd, uint8_t *ip, uint8_t *mask_ip,
			uint8_t *gateway_ip)
{
#if defined(__linux__)
	struct sockaddr_in *addr;
	struct sockaddr_in sin;
	struct rtentry route;
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	memset(&route, 0, sizeof(route));
	memset(&sin, 0, sizeof(sin));

	lws_strncpy(ifr.ifr_name, ifname, IFNAMSIZ);

	lws_plat_if_up(ifname, fd, 0);

	sin.sin_family = AF_INET;
	sin.sin_addr.s_addr = htonl(*(uint32_t *)ip);

	memcpy(&ifr.ifr_addr, &sin, sizeof(struct sockaddr));
	if (ioctl(fd, SIOCSIFADDR, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFADDR fail\n", __func__);
		return 1;
	}

	sin.sin_addr.s_addr = htonl(*(uint32_t *)mask_ip);
	memcpy(&ifr.ifr_addr, &sin, sizeof(struct sockaddr));
	if (ioctl(fd, SIOCSIFNETMASK, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFNETMASK fail\n", __func__);
		return 1;
	}

	lws_plat_if_up(ifname, fd, 1);

	addr = (struct sockaddr_in *)&route.rt_gateway;
	addr->sin_family = AF_INET;
	addr->sin_addr.s_addr = htonl(*(uint32_t *)gateway_ip);

	addr = (struct sockaddr_in *)&route.rt_dst;
	addr->sin_family = AF_INET;
	addr->sin_addr.s_addr = 0;

	addr = (struct sockaddr_in *)&route.rt_genmask;
	addr->sin_family = AF_INET;
	addr->sin_addr.s_addr = 0;

	route.rt_flags = RTF_UP | RTF_GATEWAY;
	route.rt_metric = 100;
	route.rt_dev = (char *)ifname;

	if (ioctl(fd, SIOCADDRT, &route) < 0) {
		lwsl_err("%s: SIOCADDRT 0x%x fail: %d\n", __func__,
			(unsigned int)htonl(*(uint32_t *)gateway_ip), LWS_ERRNO);
		return 1;
	}

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}